

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkCollectDistrib(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int local_24;
  int i;
  int *pUserCounts_local;
  int *pCounts_local;
  Cba_Ntk_t *p_local;
  
  for (local_24 = 1; iVar1 = Vec_StrSize(&p->vObjType), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Cba_ObjIsBox(p,local_24);
    if (iVar1 != 0) {
      iVar1 = Cba_ObjIsBoxUser(p,local_24);
      if (iVar1 == 0) {
        CVar2 = Cba_ObjType(p,local_24);
        pCounts[CVar2] = pCounts[CVar2] + 1;
      }
      else {
        iVar1 = Cba_ObjNtkId(p,local_24);
        pUserCounts[iVar1] = pUserCounts[iVar1] + 1;
      }
    }
  }
  return;
}

Assistant:

void Cba_NtkCollectDistrib( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    int i;
    Cba_NtkForEachBox( p, i )
        if ( Cba_ObjIsBoxUser(p, i) )
            pUserCounts[Cba_ObjNtkId(p, i)]++;
        else
            pCounts[Cba_ObjType(p, i)]++;
}